

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O0

QString * __thiscall ProjectGenerator::fixPathToQmake(ProjectGenerator *this,QString *file)

{
  long lVar1;
  bool bVar2;
  QLatin1String *in_RDX;
  QLatin1StringView *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QLatin1StringView *rhs;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  CaseSensitivity local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->m_data = (char *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = -0x5555555555555556;
  rhs = in_RDI;
  QString::QString((QString *)in_RDI,(QString *)in_RDI);
  QLatin1String::QLatin1String(in_RDX,(char *)CONCAT17(uVar3,in_stack_ffffffffffffffb8));
  bVar2 = ::operator!=((QString *)CONCAT17(uVar3,in_stack_ffffffffffffffb8),rhs);
  if (bVar2) {
    QLatin1String::QLatin1String(in_RDX,(char *)CONCAT17(uVar3,in_stack_ffffffffffffffb8));
    QString::replace((QString *)in_RDI,(QLatin1String *)&Option::dir_sep,local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)rhs;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectGenerator::fixPathToQmake(const QString &file)
{
    QString ret = file;
    if(Option::dir_sep != QLatin1String("/"))
        ret.replace(Option::dir_sep, QLatin1String("/"));
    return ret;
}